

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::scrollTo(QTreeView *this,QModelIndex *index,ScrollHint hint)

{
  QPersistentModelIndex *pQVar1;
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ScrollMode SVar8;
  Representation RVar9;
  Representation RVar10;
  int iVar11;
  State SVar12;
  int iVar13;
  QScrollBar *pQVar14;
  int iVar15;
  long in_FS_OFFSET;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [12];
  Representation RStack_6c;
  QAbstractItemModel *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) ||
     (this_00 = *(QTreeViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8,
     (index->m).ptr != (this_00->super_QAbstractItemViewPrivate).model)) goto LAB_005ab67c;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  QTreeViewPrivate::updateScrollBars(this_00);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_58,pQVar2,index);
  }
  pQVar1 = &(this_00->super_QAbstractItemViewPrivate).root;
  cVar5 = comparesEqual(pQVar1,(QModelIndex *)&local_58);
  if (cVar5 == '\0') {
    do {
      if ((((int)local_58 < 0) || ((long)local_58 < 0)) ||
         ((local_48.ptr == (QAbstractItemModel *)0x0 ||
          ((SVar12 = QAbstractItemView::state((QAbstractItemView *)this), SVar12 != NoState ||
           (this_00->itemsExpandable != true)))))) break;
      bVar6 = isExpanded(this,(QModelIndex *)&local_58);
      if (!bVar6) {
        expand(this,(QModelIndex *)&local_58);
      }
      pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar2 + 0x68))(local_78,pQVar2,(QModelIndex *)&local_58);
      local_48.ptr = local_68;
      local_58 = (undefined1 *)local_78._0_8_;
      puStack_50 = stack0xffffffffffffff90;
      cVar5 = comparesEqual(pQVar1,(QModelIndex *)&local_58);
    } while (cVar5 == '\0');
  }
  iVar7 = QTreeViewPrivate::viewIndex(this_00,index);
  if (iVar7 < 0) goto LAB_005ab67c;
  pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  register0x00000008 =
       (undefined1 *)
       CONCAT44((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i,
                (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i);
  local_78._0_8_ = (undefined1 *)0x0;
  SVar8 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar8 == ScrollPerItem) {
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar11 = QAbstractSlider::value(&pQVar14->super_QAbstractSlider);
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar13 = QAbstractSlider::pageStep(&pQVar14->super_QAbstractSlider);
    if (((hint == EnsureVisible) && (iVar11 <= iVar7)) && (iVar7 < iVar13 + iVar11))
    goto LAB_005ab5d7;
    if ((hint != PositionAtTop) && (hint != EnsureVisible || iVar11 <= iVar7)) {
      iVar11 = QTreeViewPrivate::itemHeight(this_00,iVar7);
      iVar13 = (RStack_6c.m_i - local_78._4_4_) + 1;
      if (hint == PositionAtCenter) {
        iVar13 = iVar11 + iVar13 / 2 + -1;
      }
      if (iVar11 < iVar13) {
        do {
          iVar11 = QTreeViewPrivate::itemHeight(this_00,iVar7);
          iVar13 = iVar13 - iVar11;
          if (iVar13 < 0) {
            iVar7 = iVar7 + 1;
            goto LAB_005ab5c4;
          }
          bVar6 = 0 < iVar7;
          iVar7 = iVar7 + -1;
        } while (bVar6);
        iVar7 = -1;
      }
    }
LAB_005ab5c4:
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
LAB_005ab5d2:
    QAbstractSlider::setValue(&pQVar14->super_QAbstractSlider,iVar7);
  }
  else {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    RVar9.m_i = QHeaderView::sectionViewportPosition
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x590),index->c);
    RVar10.m_i = QTreeViewPrivate::coordinateForItem(this_00,iVar7);
    iVar11 = QHeaderView::sectionSize
                       (*(QHeaderView **)
                         (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x590),index->c);
    iVar7 = QTreeViewPrivate::itemHeight(this_00,iVar7);
    local_88._4_4_ = RVar10.m_i;
    local_88._0_4_ = RVar9.m_i;
    uStack_80._0_4_ = RVar9.m_i + -1 + iVar11;
    uStack_80._4_4_ = iVar7 + RVar10.m_i + -1;
    if ((RVar9.m_i <= uStack_80._0_4_) && (RVar10.m_i <= uStack_80._4_4_)) {
      if (hint == EnsureVisible) {
        cVar5 = QRect::contains((QRect *)local_78,SUB81(&local_88,0));
        if (cVar5 != '\0') {
          QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                          .viewport,(QRect *)&local_88);
          goto LAB_005ab5d7;
        }
        bVar6 = true;
        if ((int)local_78._4_4_ <= local_88._4_4_) {
          bVar6 = (RStack_6c.m_i - local_78._4_4_) + 1 < (uStack_80._4_4_ - local_88._4_4_) + 1;
        }
      }
      else {
        bVar6 = false;
      }
      if (hint == EnsureVisible) {
        if (uStack_80._4_4_ <= RStack_6c.m_i) goto LAB_005ab4d8;
        bVar4 = (uStack_80._4_4_ - local_88._4_4_) + 1 < (RStack_6c.m_i - local_78._4_4_) + 1;
      }
      else {
LAB_005ab4d8:
        bVar4 = false;
      }
      pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar7 = QAbstractSlider::value(&pQVar14->super_QAbstractSlider);
      if ((bool)(hint != PositionAtTop & (bVar6 ^ 1U))) {
        if ((bool)(hint != PositionAtBottom & (bVar4 ^ 1U))) {
          if (hint == PositionAtCenter) {
            iVar7 = (iVar7 + local_88._4_4_) -
                    (((RStack_6c.m_i + local_88._4_4_) - local_78._4_4_) - uStack_80._4_4_) / 2;
          }
        }
        else {
          iVar7 = uStack_80._4_4_ + iVar7 + ~RStack_6c.m_i + local_78._4_4_;
        }
      }
      else {
        iVar7 = iVar7 + local_88._4_4_;
      }
      pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      goto LAB_005ab5d2;
    }
  }
LAB_005ab5d7:
  pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  iVar15 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
  iVar7 = QHeaderView::offset(this_00->header);
  iVar11 = QHeaderView::sectionPosition(this_00->header,index->c);
  iVar13 = QHeaderView::sectionSize(this_00->header,index->c);
  if (hint == PositionAtCenter) {
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar11 = iVar11 - (iVar15 - iVar13) / 2;
  }
  else if ((iVar11 - iVar7 < 0) || (iVar15 < iVar13)) {
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  }
  else {
    if ((iVar11 - iVar7) + iVar13 <= iVar15) goto LAB_005ab67c;
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar11 = (iVar11 - iVar15) + iVar13;
  }
  QAbstractSlider::setValue(&pQVar14->super_QAbstractSlider,iVar11);
LAB_005ab67c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTreeView);

    if (!d->isIndexValid(index))
        return;

    d->executePostedLayout();
    d->updateScrollBars();

    // Expand all parents if the parent(s) of the node are not expanded.
    QModelIndex parent = index.parent();
    while (parent != d->root && parent.isValid() && state() == NoState && d->itemsExpandable) {
        if (!isExpanded(parent))
            expand(parent);
        parent = d->model->parent(parent);
    }

    int item = d->viewIndex(index);
    if (item < 0)
        return;

    QRect area = d->viewport->rect();

    // vertical
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int top = verticalScrollBar()->value();
        int bottom = top + verticalScrollBar()->pageStep();
        if (hint == EnsureVisible && item >= top && item < bottom) {
            // nothing to do
        } else if (hint == PositionAtTop || (hint == EnsureVisible && item < top)) {
            verticalScrollBar()->setValue(item);
        } else { // PositionAtBottom or PositionAtCenter
            const int currentItemHeight = d->itemHeight(item);
            int y = (hint == PositionAtCenter
                 //we center on the current item with a preference to the top item (ie. -1)
                     ? area.height() / 2 + currentItemHeight - 1
                 //otherwise we simply take the whole space
                     : area.height());
            if (y > currentItemHeight) {
                while (item >= 0) {
                    y -= d->itemHeight(item);
                    if (y < 0) { //there is no more space left
                        item++;
                        break;
                    }
                    item--;
                }
            }
            verticalScrollBar()->setValue(item);
        }
    } else { // ScrollPerPixel
        QRect rect(columnViewportPosition(index.column()),
                   d->coordinateForItem(item), // ### slow for items outside the view
                   columnWidth(index.column()),
                   d->itemHeight(item));

        if (rect.isEmpty()) {
            // nothing to do
        } else if (hint == EnsureVisible && area.contains(rect)) {
            d->viewport->update(rect);
            // nothing to do
        } else {
            bool above = (hint == EnsureVisible
                        && (rect.top() < area.top()
                            || area.height() < rect.height()));
            bool below = (hint == EnsureVisible
                        && rect.bottom() > area.bottom()
                        && rect.height() < area.height());

            int verticalValue = verticalScrollBar()->value();
            if (hint == PositionAtTop || above)
                verticalValue += rect.top();
            else if (hint == PositionAtBottom || below)
                verticalValue += rect.bottom() - area.height();
            else if (hint == PositionAtCenter)
                verticalValue += rect.top() - ((area.height() - rect.height()) / 2);
            verticalScrollBar()->setValue(verticalValue);
        }
    }
    // horizontal
    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->header->offset();
    int horizontalPosition = d->header->sectionPosition(index.column());
    int cellWidth = d->header->sectionSize(index.column());

    if (hint == PositionAtCenter) {
        horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
    } else {
        if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
            horizontalScrollBar()->setValue(horizontalPosition);
        else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
            horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
    }
}